

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_FullRHS(void *arkode_mem,realtype t,N_Vector y,N_Vector f,int mode)

{
  bool bVar1;
  int iVar2;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ARKodeMem in_XMM0_Qa;
  int recomputeRHS;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar3;
  char *in_stack_ffffffffffffffc0;
  ARKodeMem in_stack_ffffffffffffffc8;
  
  iVar2 = erkStep_AccessStepMem
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (ARKodeERKStepMem *)0x1143558);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (in_ECX == 0) {
    iVar2 = (**(code **)in_stack_ffffffffffffffc0)
                      (in_XMM0_Qa,in_RSI,**(undefined8 **)(in_stack_ffffffffffffffc0 + 8),
                       in_stack_ffffffffffffffc8->user_data);
    *(long *)(in_stack_ffffffffffffffc0 + 0x28) = *(long *)(in_stack_ffffffffffffffc0 + 0x28) + 1;
    if (iVar2 != 0) {
      arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,"ARKode::ERKStep"
                      ,"erkStep_FullRHS",
                      "At t = %lg, the right-hand side routine failed in an unrecoverable manner.");
      return -8;
    }
    N_VScale((realtype)in_stack_ffffffffffffffc0,
             (N_Vector)CONCAT44(in_stack_ffffffffffffffbc,in_ECX),(N_Vector)0x1143639);
  }
  else if (in_ECX == 1) {
    bVar1 = 1e-10 < ABS(*(double *)
                         (*(long *)(*(long *)(in_stack_ffffffffffffffc0 + 0x20) + 0x18) +
                         (long)(*(int *)(in_stack_ffffffffffffffc0 + 0x18) + -1) * 8) - 1.0);
    uVar3 = (uint)bVar1;
    if (uVar3 == 0) {
      N_VScale((realtype)in_stack_ffffffffffffffc0,(N_Vector)(ulong)CONCAT14(bVar1,1),
               (N_Vector)0x1143753);
    }
    else {
      iVar2 = (**(code **)in_stack_ffffffffffffffc0)
                        (in_XMM0_Qa,in_RSI,**(undefined8 **)(in_stack_ffffffffffffffc0 + 8),
                         in_stack_ffffffffffffffc8->user_data);
      *(long *)(in_stack_ffffffffffffffc0 + 0x28) = *(long *)(in_stack_ffffffffffffffc0 + 0x28) + 1;
      if (iVar2 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,
                        "ARKode::ERKStep","erkStep_FullRHS",
                        "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
    }
    N_VScale((realtype)in_stack_ffffffffffffffc0,(N_Vector)CONCAT44(uVar3,in_ECX),
             (N_Vector)0x1143771);
  }
  else {
    if (in_ECX != 2) {
      arkProcessError(in_stack_ffffffffffffffc8,-8,"ARKode::ERKStep","erkStep_FullRHS",
                      "Unknown full RHS mode");
      return -8;
    }
    iVar2 = (**(code **)in_stack_ffffffffffffffc0)
                      (in_XMM0_Qa,in_RSI,in_RDX,in_stack_ffffffffffffffc8->user_data);
    *(long *)(in_stack_ffffffffffffffc0 + 0x28) = *(long *)(in_stack_ffffffffffffffc0 + 0x28) + 1;
    if (iVar2 != 0) {
      arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,"ARKode::ERKStep"
                      ,"erkStep_FullRHS",
                      "At t = %lg, the right-hand side routine failed in an unrecoverable manner.");
      return -8;
    }
  }
  return 0;
}

Assistant:

int erkStep_FullRHS(void* arkode_mem, realtype t, N_Vector y, N_Vector f,
                    int mode)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  booleantype recomputeRHS;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "erkStep_FullRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* perform RHS functions contingent on 'mode' argument */
  switch(mode) {

  /* ARK_FULLRHS_START: called at the beginning of a simulation
     Store the vectors f(t,y) in F[0] for possible reuse
     in the first stage of the subsequent time step */
  case ARK_FULLRHS_START:

    /* call f */
    retval = step_mem->f(t, y, step_mem->F[0], ark_mem->user_data);
    step_mem->nfe++;
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ERKStep",
                      "erkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* copy RHS vector into output */
    N_VScale(ONE, step_mem->F[0], f);

    break;


  /* ARK_FULLRHS_END: called at the end of a successful step
     If the method coefficients support it, we just copy the last stage RHS
     vectors to fill f instead of calling f(t,y).
     Copy the results to F[0] if the coefficients support it. */
  case ARK_FULLRHS_END:

    /* determine if explicit RHS function needs to be recomputed */
    recomputeRHS = SUNFALSE;
    if (SUNRabs(step_mem->B->c[step_mem->stages - 1] - ONE) > TINY)
      recomputeRHS = SUNTRUE;

    /* base RHS calls on recomputeRHS argument */
    if (recomputeRHS) {

      /* call f */
      retval = step_mem->f(t, y, step_mem->F[0], ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ERKStep",
                        "erkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }

    } else {
      N_VScale(ONE, step_mem->F[step_mem->stages-1], step_mem->F[0]);
    }

    /* copy RHS vector into output */
    N_VScale(ONE, step_mem->F[0], f);

    break;

  /*  ARK_FULLRHS_OTHER: called for dense output in-between steps
      store the intermediate calculations in such a way as to not
      interfere with the other two modes */
  case ARK_FULLRHS_OTHER:

    /* call f */
    retval = step_mem->f(t, y, f, ark_mem->user_data);
    step_mem->nfe++;
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ERKStep",
                      "erkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ERKStep",
                    "erkStep_FullRHS", "Unknown full RHS mode");
    return(ARK_RHSFUNC_FAIL);
  }

  return(ARK_SUCCESS);
}